

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813_9.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementHexaANCF_3813_9::ComputeKRMmatricesGlobal(ChElementHexaANCF_3813_9 *this)

{
  ChMatrixRef *in_RSI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  
  ComputeKRMmatricesGlobal
            ((ChElementHexaANCF_3813_9 *)&this[-1].field_0x52f8,in_RSI,in_XMM0_Qa,in_XMM1_Qa,
             in_XMM2_Qa);
  return;
}

Assistant:

void ChElementHexaANCF_3813_9::ComputeKRMmatricesGlobal(ChMatrixRef H, double Kfactor, double Rfactor, double Mfactor) {
    assert((H.rows() == 33) && (H.cols() == 33));

    // Calculate the linear combination Kfactor*(K) + Rfactor*(R)
    ComputeInternalJacobians(Kfactor, Rfactor);

    // Load Jac + Mfactor*(M) into H
    for (int i = 0; i < 33; i++)
        for (int j = 0; j < 33; j++)
            H(i, j) = m_JacobianMatrix(i, j) + Mfactor * m_MassMatrix(i, j);
}